

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# half.cpp
# Opt level: O0

istream * operator>>(istream *is,half *h)

{
  half *in_RSI;
  istream *in_RDI;
  float f;
  uint16_t local_16;
  float in_stack_ffffffffffffffec;
  
  std::istream::operator>>(in_RDI,(float *)&stack0xffffffffffffffec);
  Imath_3_2::half::half(in_RSI,in_stack_ffffffffffffffec);
  in_RSI->_h = local_16;
  return (istream *)in_RDI;
}

Assistant:

IMATH_EXPORT istream&
operator>> (istream& is, half& h)
{
    float f;
    is >> f;
    h = half (f);
    return is;
}